

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_lib.cc
# Opt level: O2

int PEM_read_bio(BIO *bp,char **name,char **header,uchar **data,long *len)

{
  bool bVar1;
  char **ppcVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  BUF_MEM *pBVar7;
  BUF_MEM *pBVar8;
  BUF_MEM *pBVar9;
  size_t sVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar11;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  uint uVar12;
  long lVar13;
  int line;
  ulong __n;
  int bl;
  BUF_MEM *local_1a8;
  BUF_MEM *local_1a0;
  BUF_MEM *local_198;
  char **local_190;
  int k;
  uchar **local_180;
  char **local_178;
  long *local_170;
  char buf [256];
  EVP_ENCODE_CTX ctx;
  
  bl = 0;
  local_178 = name;
  local_170 = len;
  pBVar7 = BUF_MEM_new();
  pBVar8 = BUF_MEM_new();
  pBVar9 = BUF_MEM_new();
  if (pBVar9 == (BUF_MEM *)0x0 || (pBVar8 == (BUF_MEM *)0x0 || pBVar7 == (BUF_MEM *)0x0)) {
    BUF_MEM_free(pBVar7);
    BUF_MEM_free(pBVar8);
    goto LAB_0018605c;
  }
  buf[0xfe] = '\0';
  local_1a8 = pBVar8;
  local_1a0 = pBVar9;
  local_198 = pBVar7;
  local_190 = header;
  local_180 = data;
  do {
    do {
      uVar3 = BIO_gets(bp,buf,0xfe);
      if ((int)uVar3 < 1) {
        ERR_put_error(9,0,0x6e,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_lib.cc"
                      ,0x23f);
        pBVar7 = local_1a8;
        pBVar9 = local_1a0;
        pBVar8 = local_198;
        goto LAB_00186049;
      }
      for (; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
        if (' ' < buf[uVar3]) goto LAB_00185e8d;
      }
      uVar3 = 0xffffffff;
LAB_00185e8d:
      buf[uVar3 + 1] = '\n';
      buf[uVar3 + 2] = '\0';
      iVar4 = bcmp(buf,"-----BEGIN ",0xb);
    } while (iVar4 != 0);
    sVar10 = strlen(buf + 0xb);
    lVar13 = sVar10 << 0x20;
    iVar4 = strncmp(buf + (lVar13 + 0x500000000 >> 0x20),"-----\n",6);
    pBVar8 = local_198;
  } while (iVar4 != 0);
  iVar4 = BUF_MEM_grow(local_198,lVar13 + 0x900000000 >> 0x20);
  pBVar7 = local_1a8;
  pBVar9 = local_1a0;
  if (CONCAT44(extraout_var,iVar4) != 0) {
    sVar10 = lVar13 + -0x600000000 >> 0x20;
    if (lVar13 + -0x600000000 != 0) {
      memcpy(pBVar8->data,buf + 0xb,sVar10);
    }
    pBVar8->data[sVar10] = '\0';
    iVar4 = BUF_MEM_grow(pBVar7,0x100);
    pBVar9 = local_1a0;
    if (CONCAT44(extraout_var_00,iVar4) != 0) {
      pcVar11 = pBVar7->data;
      uVar3 = 0;
      while( true ) {
        *pcVar11 = '\0';
        uVar5 = BIO_gets(bp,buf,0xfe);
        bVar1 = true;
        if ((int)uVar5 < 1) break;
        for (; -1 < (int)uVar5; uVar5 = uVar5 - 1) {
          if (' ' < buf[uVar5]) goto LAB_00185fab;
        }
        uVar5 = 0xffffffff;
LAB_00185fab:
        buf[uVar5 + 1] = '\n';
        uVar5 = uVar5 + 2;
        buf[uVar5] = '\0';
        if (buf[0] == '\n') break;
        iVar4 = BUF_MEM_grow(local_1a8,(ulong)(uVar5 + uVar3 + 9));
        pBVar7 = local_1a8;
        pBVar9 = local_1a0;
        pBVar8 = local_198;
        if (CONCAT44(extraout_var_01,iVar4) == 0) goto LAB_00186049;
        iVar4 = bcmp(buf,"-----END ",9);
        pBVar9 = local_1a8;
        if (iVar4 == 0) {
          bVar1 = false;
          break;
        }
        memcpy(local_1a8->data + uVar3,buf,(ulong)uVar5);
        pcVar11 = pBVar9->data + (uVar5 + uVar3);
        uVar3 = uVar5 + uVar3;
      }
      pBVar9 = local_1a0;
      bl = 0;
      iVar4 = BUF_MEM_grow(local_1a0,0x400);
      pBVar7 = local_1a8;
      pBVar8 = local_198;
      if (CONCAT44(extraout_var_02,iVar4) != 0) {
        *pBVar9->data = '\0';
        pBVar7 = pBVar9;
        pBVar9 = local_1a8;
        uVar5 = uVar3;
        if (bVar1) {
          uVar3 = 0;
          do {
            uVar6 = BIO_gets(bp,buf,0xfe);
            pBVar7 = local_1a8;
            pBVar9 = local_1a0;
            uVar5 = bl;
            if ((int)uVar6 < 1) goto LAB_001861e2;
            for (; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
              if (' ' < buf[uVar6]) goto LAB_001860f4;
            }
            uVar6 = 0xffffffff;
LAB_001860f4:
            buf[uVar6 + 1] = '\n';
            __n = (ulong)(uVar6 + 2);
            buf[__n] = '\0';
            iVar4 = bcmp(buf,"-----END ",9);
            pBVar9 = local_1a0;
            pBVar7 = local_1a8;
            uVar5 = bl;
            if ((0x3f < (int)uVar6) || (iVar4 == 0)) goto LAB_001861e2;
            iVar4 = BUF_MEM_grow_clean(local_1a0,(long)(int)(uVar6 + uVar3 + 0xb));
            pBVar7 = local_1a8;
            pBVar8 = local_198;
            if (CONCAT44(extraout_var_03,iVar4) == 0) goto LAB_00186049;
            memcpy(pBVar9->data + (int)uVar3,buf,__n);
            uVar3 = uVar3 + uVar6 + 2;
            pBVar9->data[(int)uVar3] = '\0';
            bl = uVar3;
          } while (__n == 0x41);
          buf[0] = '\0';
          uVar6 = BIO_gets(bp,buf,0xfe);
          pBVar7 = local_1a8;
          pBVar9 = local_1a0;
          uVar5 = bl;
          if (0 < (int)uVar6) {
            for (; (uVar12 = 0xffffffff, -1 < (int)uVar6 && (uVar12 = uVar6, buf[uVar6] < '!'));
                uVar6 = uVar6 - 1) {
            }
            buf[uVar12 + 1] = '\n';
            buf[uVar12 + 2] = '\0';
          }
        }
LAB_001861e2:
        bl = uVar5;
        ppcVar2 = local_190;
        iVar4 = bcmp(buf,"-----END ",9);
        if (iVar4 == 0) {
          pcVar11 = local_198->data;
          sVar10 = strlen(pcVar11);
          iVar4 = strncmp(pcVar11,buf + 9,(long)(int)sVar10);
          if ((iVar4 != 0) ||
             (iVar4 = strncmp(buf + ((long)((sVar10 << 0x20) + 0x900000000) >> 0x20),"-----\n",6),
             iVar4 != 0)) goto LAB_00186252;
          EVP_DecodeInit((EVP_ENCODE_CTX *)&ctx);
          iVar4 = EVP_DecodeUpdate((EVP_ENCODE_CTX *)&ctx,(uchar *)pBVar9->data,&bl,
                                   (uchar *)pBVar9->data,uVar3);
          if (-1 < iVar4) {
            iVar4 = EVP_DecodeFinal((EVP_ENCODE_CTX *)&ctx,(uchar *)(pBVar9->data + bl),&k);
            pBVar8 = local_198;
            if (iVar4 < 0) {
              ERR_put_error(9,0,100,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_lib.cc"
                            ,0x2bf);
            }
            else {
              lVar13 = (long)bl;
              bl = (int)(lVar13 + k);
              if (bl != 0) {
                *local_178 = local_198->data;
                *ppcVar2 = pBVar7->data;
                *local_180 = (uchar *)pBVar9->data;
                *local_170 = lVar13 + k;
                OPENSSL_free(local_198);
                OPENSSL_free(pBVar7);
                OPENSSL_free(pBVar9);
                return 1;
              }
            }
            goto LAB_00186049;
          }
          iVar4 = 100;
          line = 0x2ba;
        }
        else {
LAB_00186252:
          iVar4 = 0x66;
          line = 0x2b2;
        }
        ERR_put_error(9,0,iVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_lib.cc"
                      ,line);
        pBVar8 = local_198;
      }
    }
  }
LAB_00186049:
  BUF_MEM_free(pBVar8);
  BUF_MEM_free(pBVar7);
LAB_0018605c:
  BUF_MEM_free(pBVar9);
  return 0;
}

Assistant:

int PEM_read_bio(BIO *bp, char **name, char **header, unsigned char **data,
                 long *len) {
  EVP_ENCODE_CTX ctx;
  int end = 0, i, k, bl = 0, hl = 0, nohead = 0;
  char buf[256];
  BUF_MEM *nameB;
  BUF_MEM *headerB;
  BUF_MEM *dataB, *tmpB;

  nameB = BUF_MEM_new();
  headerB = BUF_MEM_new();
  dataB = BUF_MEM_new();
  if ((nameB == NULL) || (headerB == NULL) || (dataB == NULL)) {
    BUF_MEM_free(nameB);
    BUF_MEM_free(headerB);
    BUF_MEM_free(dataB);
    return 0;
  }

  buf[254] = '\0';
  for (;;) {
    i = BIO_gets(bp, buf, 254);

    if (i <= 0) {
      OPENSSL_PUT_ERROR(PEM, PEM_R_NO_START_LINE);
      goto err;
    }

    while ((i >= 0) && (buf[i] <= ' ')) {
      i--;
    }
    buf[++i] = '\n';
    buf[++i] = '\0';

    if (strncmp(buf, "-----BEGIN ", 11) == 0) {
      i = strlen(&(buf[11]));

      if (strncmp(&(buf[11 + i - 6]), "-----\n", 6) != 0) {
        continue;
      }
      if (!BUF_MEM_grow(nameB, i + 9)) {
        goto err;
      }
      OPENSSL_memcpy(nameB->data, &(buf[11]), i - 6);
      nameB->data[i - 6] = '\0';
      break;
    }
  }
  hl = 0;
  if (!BUF_MEM_grow(headerB, 256)) {
    goto err;
  }
  headerB->data[0] = '\0';
  for (;;) {
    i = BIO_gets(bp, buf, 254);
    if (i <= 0) {
      break;
    }

    while ((i >= 0) && (buf[i] <= ' ')) {
      i--;
    }
    buf[++i] = '\n';
    buf[++i] = '\0';

    if (buf[0] == '\n') {
      break;
    }
    if (!BUF_MEM_grow(headerB, hl + i + 9)) {
      goto err;
    }
    if (strncmp(buf, "-----END ", 9) == 0) {
      nohead = 1;
      break;
    }
    OPENSSL_memcpy(&(headerB->data[hl]), buf, i);
    headerB->data[hl + i] = '\0';
    hl += i;
  }

  bl = 0;
  if (!BUF_MEM_grow(dataB, 1024)) {
    goto err;
  }
  dataB->data[0] = '\0';
  if (!nohead) {
    for (;;) {
      i = BIO_gets(bp, buf, 254);
      if (i <= 0) {
        break;
      }

      while ((i >= 0) && (buf[i] <= ' ')) {
        i--;
      }
      buf[++i] = '\n';
      buf[++i] = '\0';

      if (i != 65) {
        end = 1;
      }
      if (strncmp(buf, "-----END ", 9) == 0) {
        break;
      }
      if (i > 65) {
        break;
      }
      if (!BUF_MEM_grow_clean(dataB, i + bl + 9)) {
        goto err;
      }
      OPENSSL_memcpy(&(dataB->data[bl]), buf, i);
      dataB->data[bl + i] = '\0';
      bl += i;
      if (end) {
        buf[0] = '\0';
        i = BIO_gets(bp, buf, 254);
        if (i <= 0) {
          break;
        }

        while ((i >= 0) && (buf[i] <= ' ')) {
          i--;
        }
        buf[++i] = '\n';
        buf[++i] = '\0';

        break;
      }
    }
  } else {
    tmpB = headerB;
    headerB = dataB;
    dataB = tmpB;
    bl = hl;
  }
  i = strlen(nameB->data);
  if ((strncmp(buf, "-----END ", 9) != 0) ||
      (strncmp(nameB->data, &(buf[9]), i) != 0) ||
      (strncmp(&(buf[9 + i]), "-----\n", 6) != 0)) {
    OPENSSL_PUT_ERROR(PEM, PEM_R_BAD_END_LINE);
    goto err;
  }

  EVP_DecodeInit(&ctx);
  i = EVP_DecodeUpdate(&ctx, (unsigned char *)dataB->data, &bl,
                       (unsigned char *)dataB->data, bl);
  if (i < 0) {
    OPENSSL_PUT_ERROR(PEM, PEM_R_BAD_BASE64_DECODE);
    goto err;
  }
  i = EVP_DecodeFinal(&ctx, (unsigned char *)&(dataB->data[bl]), &k);
  if (i < 0) {
    OPENSSL_PUT_ERROR(PEM, PEM_R_BAD_BASE64_DECODE);
    goto err;
  }
  bl += k;

  if (bl == 0) {
    goto err;
  }
  *name = nameB->data;
  *header = headerB->data;
  *data = (unsigned char *)dataB->data;
  *len = bl;
  OPENSSL_free(nameB);
  OPENSSL_free(headerB);
  OPENSSL_free(dataB);
  return 1;
err:
  BUF_MEM_free(nameB);
  BUF_MEM_free(headerB);
  BUF_MEM_free(dataB);
  return 0;
}